

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase277::run(TestCase277 *this)

{
  bool bVar1;
  Orphanage OVar2;
  Builder root;
  Orphan<capnp::Data> orphan;
  PointerBuilder local_128;
  ArrayPtr<const_unsigned_char> local_110;
  WirePointer *local_100;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  OVar2 = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  OrphanBuilder::copy((EVP_PKEY_CTX *)&root,(EVP_PKEY_CTX *)OVar2.arena);
  orphan.builder.capTable = (CapTableBuilder *)root._builder.data;
  orphan.builder.location = (word *)root._builder.pointers;
  orphan.builder.tag.content = (uint64_t)root._builder.segment;
  orphan.builder.segment = (SegmentBuilder *)root._builder.capTable;
  root._builder._16_16_ = OrphanBuilder::asDataReader(&orphan.builder);
  if (root._builder.pointers == 3) {
    bVar1 = (char)root._builder.data[1] == 'o' && *root._builder.data == 0x6f66;
  }
  else {
    bVar1 = false;
  }
  root._builder.segment = (SegmentBuilder *)anon_var_dwarf_a812;
  root._builder.capTable = (CapTableBuilder *)0x3;
  root._builder._32_8_ = anon_var_dwarf_a9f8;
  if ((!bVar1) && (kj::_::Debug::minSeverity < 3)) {
    local_128.segment = (SegmentBuilder *)0x29914b;
    local_128.capTable = (CapTableBuilder *)0x3;
    local_110 = (ArrayPtr<const_unsigned_char>)OrphanBuilder::asDataReader(&orphan.builder);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x119,ERROR,
               "\"failed: expected \" \"(data(\\\"foo\\\")) == (orphan.getReader())\", _kjCondition, data(\"foo\"), orphan.getReader()"
               ,(char (*) [55])"failed: expected (data(\"foo\")) == (orphan.getReader())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&root,
               (Reader *)&local_128,(Reader *)&local_110);
  }
  MessageBuilder::getRootInternal((Builder *)&local_110,&builder.super_MessageBuilder);
  local_128.pointer = local_100;
  local_128.segment = (SegmentBuilder *)local_110.ptr;
  local_128.capTable = (CapTableBuilder *)local_110.size_;
  PointerBuilder::initStruct(&root._builder,&local_128,(StructSize)0x140006);
  local_128.pointer = root._builder.pointers + 1;
  local_128.segment = root._builder.segment;
  local_128.capTable = root._builder.capTable;
  PointerBuilder::adopt(&local_128,&orphan.builder);
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageDataCopy) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphanCopy(data("foo"));
  EXPECT_EQ(data("foo"), orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
}